

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void c2mir_finish(MIR_context_t ctx)

{
  c2mir_ctx *__ptr;
  long *__ptr_00;
  long lVar1;
  c2mir_ctx *htab;
  
  __ptr = ctx->c2mir_ctx;
  HTAB_tab_str_t_destroy((HTAB_tab_str_t **)(__ptr + 0x120));
  htab = __ptr + 0x128;
  HTAB_tab_str_t_destroy((HTAB_tab_str_t **)htab);
  do {
    __ptr_00 = *(long **)(__ptr + 0x100);
    if (__ptr_00 == (long *)0x0) {
      c2mir_finish_cold_3();
LAB_00174caf:
      c2mir_finish_cold_1();
LAB_00174cb4:
      c2mir_finish_cold_2();
      if (htab == (c2mir_ctx *)&DAT_00000002) {
        return;
      }
      if (htab != (c2mir_ctx *)0x4) {
        if (htab == (c2mir_ctx *)0x8) {
          return;
        }
        return;
      }
      return;
    }
    lVar1 = *__ptr_00;
    htab = (c2mir_ctx *)__ptr_00[2];
    if (lVar1 == 0) {
      if (htab != (c2mir_ctx *)0x0) {
        free(htab);
        free(__ptr_00);
        free(__ptr);
        ctx->c2mir_ctx = (c2mir_ctx *)0x0;
        return;
      }
      goto LAB_00174cb4;
    }
    if (htab == (c2mir_ctx *)0x0) goto LAB_00174caf;
    *__ptr_00 = lVar1 + -1;
    htab = *(c2mir_ctx **)(htab + lVar1 * 8 + -8);
    free(htab);
  } while( true );
}

Assistant:

void c2mir_finish (MIR_context_t ctx) {
  struct c2m_ctx **c2m_ctx_ptr = c2m_ctx_loc (ctx), *c2m_ctx = *c2m_ctx_ptr;

  str_finish (c2m_ctx);
  reg_memory_finish (c2m_ctx);
  free (c2m_ctx);
  *c2m_ctx_ptr = NULL;
}